

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VMSR_VMRS(DisasContext_conflict1 *s,arg_VMSR_VMRS *a)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  uintptr_t o;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGTemp *pTVar5;
  uint uVar6;
  int line;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar2 = s->isar->mvfr0;
  if ((uVar2 & 0xf0) == 0) {
switchD_0065e934_caseD_2:
    return false;
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar6 = (uint)s->features;
  if (((uVar6 >> 9 & 1) != 0) && (a->rt == 0xf)) {
    if (a->l == 0) {
      return false;
    }
    if (a->reg != 1) {
      return false;
    }
  }
  _Var1 = false;
  switch(a->reg) {
  case 0:
    _Var1 = true;
    if (((uVar2 & 0xe0) != 0) && (s->user != 0)) {
      return false;
    }
    break;
  case 1:
    break;
  case 2:
  case 3:
  case 4:
    return false;
  case 5:
    uVar6 = uVar6 >> 0x1b;
    goto joined_r0x0065e93c;
  case 6:
  case 7:
    uVar6 = uVar6 >> 0x13;
joined_r0x0065e93c:
    if ((uVar6 & 1) == 0) {
      return false;
    }
    _Var1 = true;
    if (s->user != 0) {
      return false;
    }
    break;
  case 8:
    if (s->user != 0) {
      return false;
    }
    _Var1 = true;
    break;
  case 9:
  case 10:
    _Var1 = false;
    if ((uVar2 & 0xe0) != 0 || s->user != 0) {
      return false;
    }
    break;
  default:
    goto switchD_0065e934_caseD_2;
  }
  _Var1 = full_vfp_access_check(s,_Var1);
  if (!_Var1) {
    return true;
  }
  uVar2 = a->reg;
  if (a->l != 0) {
    if (10 < uVar2) {
LAB_0065ec78:
      line = 0x2e6;
LAB_0065ec92:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                 ,line,(char *)0x0);
    }
    if ((0xe1U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x700U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 == 1) {
          if (a->rt == 0xf) {
            pTVar3 = load_cpu_offset(tcg_ctx,0x2e6c);
            tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar3,pTVar3,-0x10000000);
          }
          else {
            pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
            pTVar3 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
            local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
            tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_get_fpscr_aarch64,pTVar5,1,&local_48);
          }
          goto LAB_0065eb34;
        }
        goto LAB_0065ec78;
      }
    }
    else if (s->current_el == 1) {
      gen_set_condexec(s);
      tcg_ctx_00 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(tcg_ctx_00,INDEX_op_movi_i32,
                          (TCGArg)(tcg_ctx_00->cpu_R[0xf] + (long)tcg_ctx_00),(long)(int)s->pc_curr)
      ;
      pTVar3 = tcg_const_i32_aarch64(tcg_ctx,a->reg);
      pTVar4 = tcg_const_i32_aarch64(tcg_ctx,a->rt);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_check_hcr_el2_trap_aarch64,(TCGTemp *)0x0,3,&local_48);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      uVar2 = a->reg;
    }
    pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar5,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(int)(uVar2 * 4 + 0x2e68));
LAB_0065eb34:
    if (a->rt != 0xf) {
      store_reg(s,a->rt,pTVar3);
      return true;
    }
    pTVar4 = tcg_const_i32_aarch64(tcg_ctx,-0x10000000);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_cpsr_write_aarch64,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    return true;
  }
  switch(uVar2) {
  case 0:
  case 5:
  case 6:
  case 7:
    goto switchD_0065e934_caseD_2;
  case 1:
    pTVar3 = load_reg(s,a->rt);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_set_fpscr_aarch64,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    break;
  default:
    line = 0x30f;
    goto LAB_0065ec92;
  case 8:
    pTVar3 = load_reg(s,a->rt);
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar3,pTVar3,0x40000000);
    store_cpu_offset(tcg_ctx,pTVar3,a->reg * 4 + 0x2e68);
    break;
  case 9:
  case 10:
    pTVar3 = load_reg(s,a->rt);
    store_cpu_offset(tcg_ctx,pTVar3,a->reg * 4 + 0x2e68);
    goto switchD_0065e934_caseD_2;
  }
  gen_lookup_tb(s);
switchD_0065e934_caseD_2:
  return true;
}

Assistant:

static bool trans_VMSR_VMRS(DisasContext *s, arg_VMSR_VMRS *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp = 0;
    bool ignore_vfp_enabled = false;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        /*
         * The only M-profile VFP vmrs/vmsr sysreg is FPSCR.
         * Accesses to R15 are UNPREDICTABLE; we choose to undef.
         * (FPSCR -> r15 is a special case which writes to the PSR flags.)
         */
        if (a->rt == 15 && (!a->l || a->reg != ARM_VFP_FPSCR)) {
            return false;
        }
    }

    switch (a->reg) {
    case ARM_VFP_FPSID:
        /*
         * VFPv2 allows access to FPSID from userspace; VFPv3 restricts
         * all ID registers to privileged access only.
         */
        if (IS_USER(s) && dc_isar_feature(aa32_fpsp_v3, s)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_MVFR0:
    case ARM_VFP_MVFR1:
        if (IS_USER(s) || !arm_dc_feature(s, ARM_FEATURE_MVFR)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_MVFR2:
        if (IS_USER(s) || !arm_dc_feature(s, ARM_FEATURE_V8)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_FPSCR:
        break;
    case ARM_VFP_FPEXC:
        if (IS_USER(s)) {
            return false;
        }
        ignore_vfp_enabled = true;
        break;
    case ARM_VFP_FPINST:
    case ARM_VFP_FPINST2:
        /* Not present in VFPv3 */
        if (IS_USER(s) || dc_isar_feature(aa32_fpsp_v3, s)) {
            return false;
        }
        break;
    default:
        return false;
    }

    if (!full_vfp_access_check(s, ignore_vfp_enabled)) {
        return true;
    }

    if (a->l) {
        /* VMRS, move VFP special register to gp register */
        switch (a->reg) {
        case ARM_VFP_MVFR0:
        case ARM_VFP_MVFR1:
        case ARM_VFP_MVFR2:
        case ARM_VFP_FPSID:
            if (s->current_el == 1) {
                TCGv_i32 tcg_reg, tcg_rt;

                gen_set_condexec(s);
                gen_set_pc_im(s, s->pc_curr);
                tcg_reg = tcg_const_i32(tcg_ctx, a->reg);
                tcg_rt = tcg_const_i32(tcg_ctx, a->rt);
                gen_helper_check_hcr_el2_trap(tcg_ctx, tcg_ctx->cpu_env, tcg_rt, tcg_reg);
                tcg_temp_free_i32(tcg_ctx, tcg_reg);
                tcg_temp_free_i32(tcg_ctx, tcg_rt);
            }
            /* fall through */
        case ARM_VFP_FPEXC:
        case ARM_VFP_FPINST:
        case ARM_VFP_FPINST2:
            tmp = load_cpu_field(tcg_ctx, vfp.xregs[a->reg]);
            break;
        case ARM_VFP_FPSCR:
            if (a->rt == 15) {
                tmp = load_cpu_field(tcg_ctx, vfp.xregs[ARM_VFP_FPSCR]);
                tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 0xf0000000);
            } else {
                tmp = tcg_temp_new_i32(tcg_ctx);
                gen_helper_vfp_get_fpscr(tcg_ctx, tmp, tcg_ctx->cpu_env);
            }
            break;
        default:
            g_assert_not_reached();
        }

        if (a->rt == 15) {
            /* Set the 4 flag bits in the CPSR.  */
            gen_set_nzcv(tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        } else {
            store_reg(s, a->rt, tmp);
        }
    } else {
        /* VMSR, move gp register to VFP special register */
        switch (a->reg) {
        case ARM_VFP_FPSID:
        case ARM_VFP_MVFR0:
        case ARM_VFP_MVFR1:
        case ARM_VFP_MVFR2:
            /* Writes are ignored.  */
            break;
        case ARM_VFP_FPSCR:
            tmp = load_reg(s, a->rt);
            gen_helper_vfp_set_fpscr(tcg_ctx, tcg_ctx->cpu_env, tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
            gen_lookup_tb(s);
            break;
        case ARM_VFP_FPEXC:
            /*
             * TODO: VFP subarchitecture support.
             * For now, keep the EN bit only
             */
            tmp = load_reg(s, a->rt);
            tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 1 << 30);
            store_cpu_field(tcg_ctx, tmp, vfp.xregs[a->reg]);
            gen_lookup_tb(s);
            break;
        case ARM_VFP_FPINST:
        case ARM_VFP_FPINST2:
            tmp = load_reg(s, a->rt);
            store_cpu_field(tcg_ctx, tmp, vfp.xregs[a->reg]);
            break;
        default:
            g_assert_not_reached();
        }
    }

    return true;
}